

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void stbi__gif_parse_colortable(stbi__context *s,stbi_uc (*pal) [4],int num_entries,int transp)

{
  stbi_uc sVar1;
  undefined1 uVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int i;
  stbi__context *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    *(stbi_uc *)(in_RSI + 2 + (long)local_1c * 4) = sVar1;
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    *(stbi_uc *)(in_RSI + 1 + (long)local_1c * 4) = sVar1;
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    *(stbi_uc *)(in_RSI + (long)local_1c * 4) = sVar1;
    uVar2 = 0xff;
    if (in_ECX == local_1c) {
      uVar2 = 0;
    }
    *(undefined1 *)(in_RSI + 3 + (long)local_1c * 4) = uVar2;
  }
  return;
}

Assistant:

static void stbi__gif_parse_colortable(stbi__context *s, stbi_uc pal[256][4], int num_entries, int transp)
{
   int i;
   for (i=0; i < num_entries; ++i) {
      pal[i][2] = stbi__get8(s);
      pal[i][1] = stbi__get8(s);
      pal[i][0] = stbi__get8(s);
      pal[i][3] = transp == i ? 0 : 255;
   }
}